

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O1

RTPTime __thiscall jrtplib::RTPSession::GetRTCPDelay(RTPSession *this)

{
  RTPTime RVar1;
  
  if ((this->created == true) && (this->usingpollthread == false)) {
    RVar1 = RTCPScheduler::GetTransmissionDelay(&this->rtcpsched);
    return (RTPTime)RVar1.m_t;
  }
  return (RTPTime)0.0;
}

Assistant:

RTPTime RTPSession::GetRTCPDelay()
{
	if (!created)
		return RTPTime(0,0);
	if (usingpollthread)
		return RTPTime(0,0);

	SOURCES_LOCK
	SCHED_LOCK
	RTPTime t = rtcpsched.GetTransmissionDelay();
	SCHED_UNLOCK
	SOURCES_UNLOCK
	return t;
}